

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_qsort_template.h
# Opt level: O0

void ON_qsort_double(double *base,size_t num)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double *pdVar4;
  double tmp;
  int stkptr;
  size_t size;
  double *histk [62];
  double *lostk [62];
  double *local_40;
  double *higuy;
  double *loguy;
  double *mid;
  double *hi;
  double *lo;
  size_t num_local;
  double *base_local;
  
  if ((base != (double *)0x0) && (1 < num)) {
    tmp._4_4_ = 0;
    mid = base + (num - 1);
    hi = base;
LAB_00840250:
    while (uVar3 = ((long)mid - (long)hi >> 3) + 1, 8 < uVar3) {
      loguy = hi + (uVar3 >> 1);
      if (*loguy <= *hi && *hi != *loguy) {
        dVar1 = *hi;
        *hi = *loguy;
        *loguy = dVar1;
      }
      if (*mid <= *hi && *hi != *mid) {
        dVar1 = *hi;
        *hi = *mid;
        *mid = dVar1;
      }
      if (*mid <= *loguy && *loguy != *mid) {
        dVar1 = *loguy;
        *loguy = *mid;
        *mid = dVar1;
      }
      higuy = hi;
      local_40 = mid;
      while( true ) {
        if (higuy < loguy) {
          do {
            higuy = higuy + 1;
            bVar2 = false;
            if (higuy < loguy) {
              bVar2 = *higuy <= *loguy;
            }
          } while (bVar2);
        }
        pdVar4 = local_40;
        if (loguy <= higuy) {
          do {
            higuy = higuy + 1;
            bVar2 = false;
            if (higuy <= mid) {
              bVar2 = *higuy <= *loguy;
            }
          } while (bVar2);
        }
        do {
          local_40 = pdVar4;
          pdVar4 = local_40 + -1;
          bVar2 = false;
          if (loguy < pdVar4) {
            bVar2 = *loguy <= *pdVar4 && *pdVar4 != *loguy;
          }
        } while (bVar2);
        if (pdVar4 < higuy) break;
        dVar1 = *higuy;
        *higuy = *pdVar4;
        *pdVar4 = dVar1;
        local_40 = pdVar4;
        if (loguy == pdVar4) {
          loguy = higuy;
        }
      }
      if (loguy < local_40) {
        do {
          local_40 = local_40 + -1;
          bVar2 = false;
          if (loguy < local_40) {
            bVar2 = *local_40 == *loguy;
          }
        } while (bVar2);
      }
      if (local_40 <= loguy) {
        do {
          local_40 = local_40 + -1;
          bVar2 = false;
          if (hi < local_40) {
            bVar2 = *local_40 == *loguy;
          }
        } while (bVar2);
      }
      if ((long)local_40 - (long)hi >> 3 < (long)mid - (long)higuy >> 3) {
        if (higuy < mid) {
          histk[(long)tmp._4_4_ + 0x3d] = higuy;
          histk[(long)tmp._4_4_ + -1] = mid;
          tmp._4_4_ = tmp._4_4_ + 1;
        }
        if (local_40 <= hi) goto LAB_0084063a;
        mid = local_40;
      }
      else {
        if (hi < local_40) {
          histk[(long)tmp._4_4_ + 0x3d] = hi;
          histk[(long)tmp._4_4_ + -1] = local_40;
          tmp._4_4_ = tmp._4_4_ + 1;
        }
        if (mid <= higuy) goto LAB_0084063a;
        hi = higuy;
      }
    }
    ON__shortsort(hi,mid);
LAB_0084063a:
    tmp._4_4_ = tmp._4_4_ + -1;
    if (-1 < tmp._4_4_) {
      hi = histk[(long)tmp._4_4_ + 0x3d];
      mid = histk[(long)tmp._4_4_ + -1];
      goto LAB_00840250;
    }
  }
  return;
}

Assistant:

void 
ON_QSORT_FNAME (
    ON_SORT_TEMPLATE_TYPE *base,
    size_t num
    )
{
  ON_SORT_TEMPLATE_TYPE *lo;                   /* start of sub-array currently sorting */
  ON_SORT_TEMPLATE_TYPE *hi;                   /* end of sub-array currently sorting */
  ON_SORT_TEMPLATE_TYPE *mid;                  /* points to middle of subarray */
  ON_SORT_TEMPLATE_TYPE *loguy;                /* traveling pointers for partition step */
  ON_SORT_TEMPLATE_TYPE *higuy;                /* traveling pointers for partition step */
  ON_SORT_TEMPLATE_TYPE *lostk[ON_QSORT_STKSIZ];
  ON_SORT_TEMPLATE_TYPE *histk[ON_QSORT_STKSIZ];
  size_t size;                /* size of the sub-array */
  int stkptr;                 /* stack for saving sub-array to be processed */
  ON_SORT_TEMPLATE_TYPE tmp;

  if ( 0 == base || num < 2 )
    return;

  stkptr = 0;                 /* initialize stack */

  lo = base;
  hi = base + (num-1);        /* initialize limits */

  /* this entry point is for pseudo-recursion calling: setting
      lo and hi and jumping to here is like recursion, but stkptr is
      preserved, locals aren't, so we preserve stuff on the stack */
recurse:

  size = (hi - lo) + 1;        /* number of el's to sort */

  /* below a certain size, it is faster to use a O(n^2) sorting method */
  if (size <= ON_QSORT_CUTOFF) 
  {
      ON_QSORT_SHORT_SORT_FNAME(lo, hi);
  }
  else {
    /* First we pick a partitioning element.  The efficiency of the
        algorithm demands that we find one that is approximately the median
        of the values, but also that we select one fast.  We choose the
        median of the first, middle, and last elements, to avoid bad
        performance in the face of already sorted data, or data that is made
        up of multiple sorted runs appended together.  Testing shows that a
        median-of-three algorithm provides better performance than simply
        picking the middle element for the latter case. */

    mid = lo + (size / 2);      /* find middle element */

    /* Sort the first, middle, last elements into order */
    if ( ON_QSORT_GT(lo,mid) ) {ON_QSORT_SWAP(lo,mid);}
    if ( ON_QSORT_GT(lo,hi)  ) {ON_QSORT_SWAP(lo,hi);}
    if ( ON_QSORT_GT(mid,hi) ) {ON_QSORT_SWAP(mid,hi);}

    /* We now wish to partition the array into three pieces, one consisting
        of elements <= partition element, one of elements equal to the
        partition element, and one of elements > than it.  This is done
        below; comments indicate conditions established at every step. */

    loguy = lo;
    higuy = hi;

    /* Note that higuy decreases and loguy increases on every iteration,
        so loop must terminate. */
    for (;;)
    {
      /* lo <= loguy < hi, lo < higuy <= hi,
          A[i] <= A[mid] for lo <= i <= loguy,
          A[i] > A[mid] for higuy <= i < hi,
          A[hi] >= A[mid] */

      /* The doubled loop is to avoid calling comp(mid,mid), since some
          existing comparison funcs don't work when passed the same
          value for both pointers. */

      if (mid > loguy) 
      {
          do  {
              loguy++;
          } while (loguy < mid && ON_QSORT_LE(loguy,mid));
      }
      if (mid <= loguy) 
      {
          do  {
              loguy++;
          } while (loguy <= hi && ON_QSORT_LE(loguy,mid));
      }

      /* lo < loguy <= hi+1, A[i] <= A[mid] for lo <= i < loguy,
          either loguy > hi or A[loguy] > A[mid] */

      do  {
          higuy--;
      } while (higuy > mid && ON_QSORT_GT(higuy,mid));

      /* lo <= higuy < hi, A[i] > A[mid] for higuy < i < hi,
          either higuy == lo or A[higuy] <= A[mid] */

      if (higuy < loguy)
          break;

      /* if loguy > hi or higuy == lo, then we would have exited, so
          A[loguy] > A[mid], A[higuy] <= A[mid],
          loguy <= hi, higuy > lo */

      ON_QSORT_SWAP(loguy,higuy);

      /* If the partition element was moved, follow it.  Only need
          to check for mid == higuy, since before the swap,
          A[loguy] > A[mid] implies loguy != mid. */

      if (mid == higuy)
          mid = loguy;

      /* A[loguy] <= A[mid], A[higuy] > A[mid]; so condition at top
          of loop is re-established */
    }

    /*     A[i] <= A[mid] for lo <= i < loguy,
            A[i] > A[mid] for higuy < i < hi,
            A[hi] >= A[mid]
            higuy < loguy
        implying:
            higuy == loguy-1
            or higuy == hi - 1, loguy == hi + 1, A[hi] == A[mid] */

    /* Find adjacent elements equal to the partition element.  The
        doubled loop is to avoid calling comp(mid,mid), since some
        existing comparison funcs don't work when passed the same value
        for both pointers. */

    higuy++;
    if (mid < higuy) {
        do  {
            higuy--;
        } while (higuy > mid && ON_QSORT_EQ(higuy,mid));
    }
    if (mid >= higuy) {
        do  {
            higuy--;
        } while (higuy > lo && ON_QSORT_EQ(higuy,mid));
    }

    /* OK, now we have the following:
          higuy < loguy
          lo <= higuy <= hi
          A[i]  <= A[mid] for lo <= i <= higuy
          A[i]  == A[mid] for higuy < i < loguy
          A[i]  >  A[mid] for loguy <= i < hi
          A[hi] >= A[mid] */

    /* We've finished the partition, now we want to sort the subarrays
        [lo, higuy] and [loguy, hi].
        We do the smaller one first to minimize stack usage.
        We only sort arrays of length 2 or more.*/

    if ( higuy - lo >= hi - loguy ) {
        if (lo < higuy) {
            lostk[stkptr] = lo;
            histk[stkptr] = higuy;
            ++stkptr;
        }                           /* save big recursion for later */

        if (loguy < hi) {
            lo = loguy;
            goto recurse;           /* do small recursion */
        }
    }
    else {
        if (loguy < hi) {
            lostk[stkptr] = loguy;
            histk[stkptr] = hi;
            ++stkptr;               /* save big recursion for later */
        }

        if (lo < higuy) {
            hi = higuy;
            goto recurse;           /* do small recursion */
        }
    }
  }

  /* We have sorted the array, except for any pending sorts on the stack.
      Check if there are any, and do them. */

  --stkptr;
  if (stkptr >= 0) {
      lo = lostk[stkptr];
      hi = histk[stkptr];
      goto recurse;           /* pop subarray from stack */
  }
  else
      return;                 /* all subarrays done */
}